

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap_str.c
# Opt level: O2

char * ap_str_shrink_spaces(char *str)

{
  size_t sVar1;
  char *__s;
  size_t sVar2;
  char *__s_00;
  
  __s_00 = str;
  while( true ) {
    sVar1 = strlen(__s_00);
    __s = ap_str_find_first_char_from_set(__s_00,"\t ");
    if (__s == (char *)0x0) {
      return str;
    }
    sVar2 = strspn(__s,"\t ");
    if (sVar2 < 2) break;
    memmove(__s + 1,__s + sVar2,(size_t)(__s_00 + (sVar1 - (long)(__s + sVar2)) + 1));
    __s_00 = __s + 1;
  }
  return str;
}

Assistant:

char * ap_str_shrink_spaces (char *str)
{
	size_t seg_len = 0;
	size_t str_len = strlen (str);

	char *pos = ap_str_find_first_char_from_set (str, "\t ");
	if (pos == NULL)
	{
		goto finish;
	}

	seg_len = strspn (pos, "\t ");
	if (seg_len > 1)
	{
		memmove (pos + 1, pos + seg_len, str_len + str - pos - seg_len + 1);

		ap_str_shrink_spaces (pos + 1);
	}

finish:
	return str;
}